

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  time_t tVar4;
  size_t t;
  lua_State *L;
  uint h;
  char buff [32];
  uint local_4c;
  lua_State *local_48;
  uint *local_40;
  TValue *local_38;
  code *local_30;
  
  pvVar3 = (*f)(ud,(void *)0x0,8,0x610);
  L = (lua_State *)0x0;
  if (pvVar3 != (void *)0x0) {
    L = (lua_State *)((long)pvVar3 + 8);
    *(undefined8 *)((long)pvVar3 + 8) = 0;
    *(undefined4 *)((long)pvVar3 + 0x10) = 0x108;
    *(undefined1 *)((long)pvVar3 + 300) = 1;
    *(long *)((long)pvVar3 + 0x20) = (long)pvVar3 + 0xd8;
    *(undefined8 *)((long)pvVar3 + 0x40) = 0;
    *(undefined8 *)((long)pvVar3 + 0x48) = 0;
    *(undefined8 *)((long)pvVar3 + 0x28) = 0;
    *(undefined4 *)((long)pvVar3 + 0xc0) = 0;
    *(lua_State **)((long)pvVar3 + 0x58) = L;
    *(undefined8 *)((long)pvVar3 + 0x60) = 0;
    *(undefined8 *)((long)pvVar3 + 0xb0) = 0;
    *(undefined8 *)((long)pvVar3 + 0xc4) = 0;
    *(undefined1 *)((long)pvVar3 + 0xd4) = 1;
    *(undefined8 *)((long)pvVar3 + 0xcc) = 1;
    *(undefined1 *)((long)pvVar3 + 0x14) = 0;
    *(undefined8 *)((long)pvVar3 + 0xb8) = 0;
    *(lua_Alloc *)((long)pvVar3 + 0xd8) = f;
    *(void **)((long)pvVar3 + 0xe0) = ud;
    *(lua_State **)((long)pvVar3 + 0x1a0) = L;
    tVar4 = time((time_t *)0x0);
    local_40 = &local_4c;
    local_4c = (uint)tVar4;
    local_38 = &luaO_nilobject_;
    local_30 = lua_newstate;
    local_48 = L;
    uVar1 = luaS_hash((char *)&local_48,0x20,local_4c);
    *(uint *)((long)pvVar3 + 0x128) = uVar1;
    *(undefined1 *)((long)pvVar3 + 0x12f) = 0;
    *(undefined4 *)((long)pvVar3 + 0x120) = 0;
    *(undefined8 *)((long)pvVar3 + 0x198) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1a8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x100) = 0;
    *(undefined8 *)((long)pvVar3 + 0x108) = 0;
    *(undefined8 *)((long)pvVar3 + 0x110) = 0;
    *(undefined2 *)((long)pvVar3 + 0x12d) = 7;
    *(undefined8 *)((long)pvVar3 + 0x130) = 0;
    *(undefined8 *)((long)pvVar3 + 0x138) = 0;
    *(undefined8 *)((long)pvVar3 + 0x140) = 0;
    *(undefined8 *)((long)pvVar3 + 0x148) = 0;
    *(undefined8 *)((long)pvVar3 + 0x150) = 0;
    *(undefined8 *)((long)pvVar3 + 0x158) = 0;
    *(undefined8 *)((long)pvVar3 + 0x160) = 0;
    *(undefined8 *)((long)pvVar3 + 0x168) = 0;
    *(undefined8 *)((long)pvVar3 + 0x170) = 0;
    *(undefined8 *)((long)pvVar3 + 0x178) = 0;
    *(undefined8 *)((long)pvVar3 + 0x180) = 0;
    *(undefined8 *)((long)pvVar3 + 0xe8) = 0x610;
    *(undefined8 *)((long)pvVar3 + 0xf0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x188) = 0xc800000000;
    *(undefined4 *)((long)pvVar3 + 400) = 200;
    *(undefined8 *)((long)pvVar3 + 0x2b8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2a8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2b0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x298) = 0;
    *(undefined8 *)((long)pvVar3 + 0x2a0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x288) = 0;
    *(undefined8 *)((long)pvVar3 + 0x290) = 0;
    *(undefined8 *)((long)pvVar3 + 0x278) = 0;
    *(undefined8 *)((long)pvVar3 + 0x280) = 0;
    iVar2 = luaD_rawrunprotected(L,f_luaopen,(void *)0x0);
    if (iVar2 != 0) {
      close_state(L);
      L = (lua_State *)0x0;
    }
  }
  return L;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;
  LG *l = cast(LG *, (*f)(ud, NULL, LUA_TTHREAD, sizeof(LG)));
  if (l == NULL) return NULL;
  L = &l->l.l;
  g = &l->g;
  L->next = NULL;
  L->tt = LUA_TTHREAD;
  g->currentwhite = bitmask(WHITE0BIT);
  L->marked = luaC_white(g);
  preinit_thread(L, g);
  g->frealloc = f;
  g->ud = ud;
  g->mainthread = L;
  g->seed = makeseed(L);
  g->gcrunning = 0;  /* no GC while building state */
  g->GCestimate = 0;
  g->strt.size = g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  g->panic = NULL;
  g->version = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_NORMAL;
  g->allgc = g->finobj = g->tobefnz = g->fixedgc = NULL;
  g->sweepgc = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->twups = NULL;
  g->totalbytes = sizeof(LG);
  g->GCdebt = 0;
  g->gcfinnum = 0;
  g->gcpause = LUAI_GCPAUSE;
  g->gcstepmul = LUAI_GCMUL;
  for (i=0; i < LUA_NUMTAGS; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  return L;
}